

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O0

VP8StatusCode CheckDecBuffer(WebPDecBuffer *buffer)

{
  WEBP_CSP_MODE mode_00;
  WEBP_CSP_MODE WVar1;
  WEBP_CSP_MODE WVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  WEBP_CSP_MODE WVar6;
  WEBP_CSP_MODE WVar7;
  WEBP_CSP_MODE WVar8;
  WEBP_CSP_MODE WVar9;
  VP8StatusCode VVar10;
  WEBP_CSP_MODE *in_RDI;
  uint64_t size;
  int stride;
  WebPRGBABuffer *buf_1;
  uint64_t a_size;
  uint64_t v_size;
  uint64_t u_size;
  uint64_t y_size;
  int a_stride;
  int v_stride;
  int u_stride;
  int y_stride;
  int uv_height;
  int uv_width;
  WebPYUVABuffer *buf;
  int height;
  int width;
  WEBP_CSP_MODE mode;
  int ok;
  
  mode_00 = *in_RDI;
  WVar1 = in_RDI[1];
  WVar2 = in_RDI[2];
  iVar4 = IsValidColorspace(mode_00);
  if (iVar4 == 0) {
    bVar3 = false;
  }
  else {
    iVar4 = WebPIsRGBMode(mode_00);
    if (iVar4 == 0) {
      iVar4 = (int)(WVar1 + MODE_RGBA) / 2;
      iVar5 = (int)(WVar2 + MODE_RGBA) / 2;
      WVar6 = in_RDI[0xc];
      if ((int)WVar6 < 1) {
        WVar6 = -WVar6;
      }
      WVar7 = in_RDI[0xd];
      if ((int)WVar7 < 1) {
        WVar7 = -WVar7;
      }
      WVar8 = in_RDI[0xe];
      if ((int)WVar8 < 1) {
        WVar8 = -WVar8;
      }
      WVar9 = in_RDI[0xf];
      if ((int)WVar9 < 1) {
        WVar9 = -WVar9;
      }
      bVar3 = *(undefined8 *)(in_RDI + 8) != MODE_RGB &&
              (*(undefined8 *)(in_RDI + 6) != MODE_RGB &&
              (*(undefined8 *)(in_RDI + 4) != MODE_RGB &&
              (iVar4 <= (int)WVar8 &&
              (iVar4 <= (int)WVar7 &&
              ((int)WVar1 <= (int)WVar6 &&
              ((ulong)((long)(int)WVar8 * (long)(iVar5 + -1) + (long)iVar4) <=
               (ulong)*(undefined8 *)(in_RDI + 0x14) &&
              ((ulong)((long)(int)WVar7 * (long)(iVar5 + -1) + (long)iVar4) <=
               (ulong)*(undefined8 *)(in_RDI + 0x12) &&
              (ulong)((long)(int)WVar6 * (long)(int)(WVar2 - MODE_RGBA) + (long)(int)WVar1) <=
              (ulong)*(undefined8 *)(in_RDI + 0x10))))))));
      if (mode_00 == MODE_YUVA) {
        bVar3 = *(undefined8 *)(in_RDI + 10) != MODE_RGB &&
                ((ulong)((long)(int)WVar9 * (long)(int)(WVar2 - MODE_RGBA) + (long)(int)WVar1) <=
                 (ulong)*(undefined8 *)(in_RDI + 0x16) && ((int)WVar1 <= (int)WVar9 && bVar3));
      }
    }
    else {
      WVar6 = in_RDI[6];
      if ((int)WVar6 < 1) {
        WVar6 = -WVar6;
      }
      bVar3 = *(undefined8 *)(in_RDI + 4) != MODE_RGB &&
              ((int)(WVar1 * "\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[mode_00]) <=
               (int)WVar6 &&
              (ulong)((long)(int)WVar6 * (long)(int)(WVar2 - MODE_RGBA) +
                     (long)(int)(WVar1 * "\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"
                                         [mode_00])) <= (ulong)*(undefined8 *)(in_RDI + 8));
    }
  }
  VVar10 = VP8_STATUS_INVALID_PARAM;
  if (bVar3) {
    VVar10 = VP8_STATUS_OK;
  }
  return VVar10;
}

Assistant:

static VP8StatusCode CheckDecBuffer(const WebPDecBuffer* const buffer) {
  int ok = 1;
  const WEBP_CSP_MODE mode = buffer->colorspace;
  const int width = buffer->width;
  const int height = buffer->height;
  if (!IsValidColorspace(mode)) {
    ok = 0;
  } else if (!WebPIsRGBMode(mode)) {   // YUV checks
    const WebPYUVABuffer* const buf = &buffer->u.YUVA;
    const int uv_width  = (width  + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int y_stride = abs(buf->y_stride);
    const int u_stride = abs(buf->u_stride);
    const int v_stride = abs(buf->v_stride);
    const int a_stride = abs(buf->a_stride);
    const uint64_t y_size = MIN_BUFFER_SIZE(width, height, y_stride);
    const uint64_t u_size = MIN_BUFFER_SIZE(uv_width, uv_height, u_stride);
    const uint64_t v_size = MIN_BUFFER_SIZE(uv_width, uv_height, v_stride);
    const uint64_t a_size = MIN_BUFFER_SIZE(width, height, a_stride);
    ok &= (y_size <= buf->y_size);
    ok &= (u_size <= buf->u_size);
    ok &= (v_size <= buf->v_size);
    ok &= (y_stride >= width);
    ok &= (u_stride >= uv_width);
    ok &= (v_stride >= uv_width);
    ok &= (buf->y != NULL);
    ok &= (buf->u != NULL);
    ok &= (buf->v != NULL);
    if (mode == MODE_YUVA) {
      ok &= (a_stride >= width);
      ok &= (a_size <= buf->a_size);
      ok &= (buf->a != NULL);
    }
  } else {    // RGB checks
    const WebPRGBABuffer* const buf = &buffer->u.RGBA;
    const int stride = abs(buf->stride);
    const uint64_t size =
        MIN_BUFFER_SIZE(width * kModeBpp[mode], height, stride);
    ok &= (size <= buf->size);
    ok &= (stride >= width * kModeBpp[mode]);
    ok &= (buf->rgba != NULL);
  }
  return ok ? VP8_STATUS_OK : VP8_STATUS_INVALID_PARAM;
}